

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
* __thiscall
enact::Parser::parse
          (vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
           *__return_storage_ptr__,Parser *this)

{
  pointer pcVar1;
  unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> stmt;
  string local_f0;
  undefined1 local_d0 [168];
  
  pcVar1 = (this->m_context->m_source)._M_dataplus._M_p;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar1,pcVar1 + (this->m_context->m_source)._M_string_length);
  Lexer::Lexer((Lexer *)local_d0,&local_f0);
  std::__cxx11::string::_M_assign((string *)&this->m_scanner);
  *(ulong *)((long)&(this->m_scanner).m_current + 6) = CONCAT62(local_d0._48_6_,local_d0._46_2_);
  (this->m_scanner).m_start = local_d0._32_8_;
  (this->m_scanner).m_current = CONCAT26(local_d0._46_2_,local_d0._40_6_);
  (this->m_scanner).m_last.type = local_d0._56_4_;
  std::__cxx11::string::_M_assign((string *)&(this->m_scanner).m_last.lexeme);
  (this->m_scanner).m_last.col = local_d0._100_2_;
  (this->m_scanner).m_last.line = local_d0._96_4_;
  (this->m_scanner).m_currentInterpolations = local_d0._104_4_;
  if ((Lexer *)local_d0 != &this->m_scanner) {
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,enact::TokenType>,std::allocator<std::pair<std::__cxx11::string_const,enact::TokenType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,enact::TokenType>,std::allocator<std::pair<std::__cxx11::string_const,enact::TokenType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,enact::TokenType>,std::allocator<std::pair<std::__cxx11::string_const,enact::TokenType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(this->m_scanner).m_keywords,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)(local_d0 + 0x70));
  }
  Lexer::~Lexer((Lexer *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  advance(this);
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->m_current).type != END_OF_FILE) {
    do {
      parseStmt((Parser *)local_d0);
      if ((long *)local_d0._0_8_ != (long *)0x0) {
        std::
        vector<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>,std::allocator<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>>>
        ::emplace_back<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>>
                  ((vector<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>,std::allocator<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> *)local_d0);
      }
      if ((long *)local_d0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_d0._0_8_ + 8))();
      }
    } while ((this->m_current).type != END_OF_FILE);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<Stmt>> Parser::parse() {
        m_scanner = Lexer{m_context.getSource()};
        advance();

        std::vector<std::unique_ptr<Stmt>> ast{};
        while (!isAtEnd()) {
            std::unique_ptr<Stmt> stmt = parseStmt();
            if (stmt) ast.push_back(std::move(stmt));
        }

        return ast;
    }